

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcLocalPlacement>
                 (DB *db,LIST *params,IfcLocalPlacement *in)

{
  size_t sVar1;
  TypeError *this;
  element_type *peVar2;
  long local_148;
  TypeError *t_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcLocalPlacement *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcLocalPlacement *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
                       (db,params,(IfcObjectPlacement *)in);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 < 2) {
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 1;
    this = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"expected 2 arguments to IfcLocalPlacement",&local_49);
    TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
  }
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_70);
  if (peVar2 == (element_type *)0x0) {
    local_148 = 0;
  }
  else {
    local_148 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_148 == 0) {
    GenericConvert<Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>>>
              ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_> *)
               (base + 0x20),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,
               (DB *)params_local);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_1,(size_t)in_local);
  GenericConvert<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)(base + 0x30),
             (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1,(DB *)params_local);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1);
  return local_28;
}

Assistant:

size_t GenericFill<IfcLocalPlacement>(const DB& db, const LIST& params, IfcLocalPlacement* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcObjectPlacement*>(in));
	if (params.GetSize() < 2) { throw STEP::TypeError("expected 2 arguments to IfcLocalPlacement"); }    do { // convert the 'PlacementRelTo' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->PlacementRelTo, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcLocalPlacement to be a `IfcObjectPlacement`")); }
    } while(0);
    do { // convert the 'RelativePlacement' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->RelativePlacement, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcLocalPlacement to be a `IfcAxis2Placement`")); }
    } while(0);
	return base;
}